

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_tointegerns(TValue *obj,lua_Integer *p,F2Imod mode)

{
  double __x;
  uint uVar1;
  double dVar2;
  bool bVar3;
  
  if (obj->tt_ == '\x03') {
    *p = (lua_Integer)obj->value_;
    uVar1 = 1;
  }
  else {
    uVar1 = 0;
    if (obj->tt_ == '\x13') {
      __x = (obj->value_).n;
      dVar2 = floor(__x);
      if ((dVar2 != __x) || (NAN(dVar2) || NAN(__x))) {
        if (mode == F2Ieq) {
          return 0;
        }
        if (mode == F2Iceil) {
          dVar2 = dVar2 + 1.0;
        }
      }
      bVar3 = -9.223372036854776e+18 <= dVar2 && dVar2 < 9.223372036854776e+18;
      if (bVar3) {
        *p = (long)dVar2;
      }
      uVar1 = (uint)bVar3;
    }
  }
  return uVar1;
}

Assistant:

int luaV_tointegerns (const TValue *obj, lua_Integer *p, F2Imod mode) {
  if (ttisfloat(obj))
    return luaV_flttointeger(fltvalue(obj), p, mode);
  else if (ttisinteger(obj)) {
    *p = ivalue(obj);
    return 1;
  }
  else
    return 0;
}